

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

void * RPLIDARExpressScanThread(void *pParam)

{
  _Map_pointer ppdVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  _Map_pointer *__args;
  long lVar13;
  CRITICAL_SECTION *__mutex;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  BOOL bNewScan;
  double angles [32];
  double distances [32];
  uint local_288;
  BOOL local_284;
  deque<double,std::allocator<double>> *local_280;
  deque<double,std::allocator<double>> *local_278;
  uint local_26c;
  ulong local_268;
  void *local_260;
  void *local_258;
  long local_250;
  CRITICAL_SECTION *local_248;
  RPLIDAR *local_240;
  _Deque_base<double,_std::allocator<double>_> local_238 [3];
  double local_138 [33];
  
  local_284 = 0;
  __mutex = RPLIDARCS;
  lVar10 = 0;
  lVar16 = 0;
  lVar17 = 0;
  do {
    if (*(void **)((long)addrsRPLIDAR + lVar10 * 2) == pParam) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_268 = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(local_238,0);
      local_278 = (deque<double,std::allocator<double>> *)
                  ((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_map + lVar17);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1();
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_238[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(local_238,0);
      local_280 = (deque<double,std::allocator<double>> *)
                  ((long)&distancesvectorRPLIDAR[0].
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_map + lVar17);
      std::deque<double,_std::allocator<double>_>::_M_move_assign1();
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(local_238);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      local_260 = (void *)((long)distancesRPLIDAR[0] + lVar16);
      local_258 = (void *)((long)anglesRPLIDAR[0] + lVar16);
      uVar14 = 0;
      local_288 = 0;
      local_250 = lVar10;
      local_248 = __mutex;
      local_240 = (RPLIDAR *)pParam;
      do {
        memset(local_138,0,0x100);
        memset(local_238,0,0x100);
        local_26c = GetExpressScanDataResponseRPLIDAR
                              ((RPLIDAR *)pParam,local_138,(double *)local_238,&local_284);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(local_260,local_138,0x100);
        memcpy(local_258,local_238,0x100);
        *(BOOL *)((long)bNewScanRPLIDAR + lVar10) = local_284;
        lVar16 = 0;
        do {
          uVar15 = local_288;
          uVar6 = uVar14;
          if (((RPLIDAR *)pParam)->maxhist == 0) {
            lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                      super__Deque_impl_data._M_finish._M_node + lVar17);
            lVar2 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_node + lVar17);
            lVar3 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                     super__Deque_impl_data._M_start._M_cur + lVar17);
            lVar10 = (*(long *)((long)&anglesvectorRPLIDAR[0].
                                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                       super__Deque_impl_data._M_start._M_last + lVar17) - lVar3 >>
                     3) + (*(long *)((long)&anglesvectorRPLIDAR[0].
                                            super__Deque_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17
                                    ) -
                           *(long *)((long)&anglesvectorRPLIDAR[0].
                                            super__Deque_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_first +
                                    lVar17) >> 3) +
                     ((((ulong)(lVar10 - lVar2) >> 3) - 1) + (ulong)(lVar10 == 0)) * 0x40;
            if (4 < (int)lVar10) {
              lVar10 = lVar10 << 0x20;
              lVar13 = lVar10 + -0x500000000 >> 0x20;
              lVar7 = lVar3 - *(long *)((long)&anglesvectorRPLIDAR[0].
                                               super__Deque_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Deque_impl_data._M_start._M_first +
                                       lVar17) >> 3;
              uVar8 = lVar7 + lVar13;
              if (uVar8 < 0x40) {
                pdVar9 = (double *)(lVar3 + lVar13 * 8);
              }
              else {
                uVar12 = uVar8 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar8) {
                  uVar12 = uVar8 >> 6;
                }
                pdVar9 = (double *)((uVar8 + uVar12 * -0x40) * 8 + *(long *)(lVar2 + uVar12 * 8));
              }
              ppdVar1 = (&local_238[0]._M_impl.super__Deque_impl_data._M_map)[lVar16];
              if (3.141592653589793 < (double)ppdVar1 - *pdVar9) {
                lVar13 = lVar10 + -0x400000000 >> 0x20;
                uVar8 = lVar7 + lVar13;
                if (uVar8 < 0x40) {
                  pdVar9 = (double *)(lVar3 + lVar13 * 8);
                }
                else {
                  uVar12 = uVar8 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar8) {
                    uVar12 = uVar8 >> 6;
                  }
                  pdVar9 = (double *)((uVar8 + uVar12 * -0x40) * 8 + *(long *)(lVar2 + uVar12 * 8));
                }
                if (3.141592653589793 < (double)ppdVar1 - *pdVar9) {
                  lVar13 = lVar10 + -0x300000000 >> 0x20;
                  uVar8 = lVar7 + lVar13;
                  if (uVar8 < 0x40) {
                    pdVar9 = (double *)(lVar3 + lVar13 * 8);
                  }
                  else {
                    uVar12 = uVar8 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar8) {
                      uVar12 = uVar8 >> 6;
                    }
                    pdVar9 = (double *)
                             ((uVar8 + uVar12 * -0x40) * 8 + *(long *)(lVar2 + uVar12 * 8));
                  }
                  if (3.141592653589793 < (double)ppdVar1 - *pdVar9) {
                    lVar13 = lVar10 + -0x200000000 >> 0x20;
                    uVar8 = lVar7 + lVar13;
                    if (uVar8 < 0x40) {
                      pdVar9 = (double *)(lVar3 + lVar13 * 8);
                    }
                    else {
                      uVar12 = uVar8 >> 6 | 0xfc00000000000000;
                      if (0 < (long)uVar8) {
                        uVar12 = uVar8 >> 6;
                      }
                      pdVar9 = (double *)
                               ((uVar8 + uVar12 * -0x40) * 8 + *(long *)(lVar2 + uVar12 * 8));
                    }
                    if (3.141592653589793 < (double)ppdVar1 - *pdVar9) {
                      lVar10 = lVar10 + -0x100000000 >> 0x20;
                      uVar8 = lVar7 + lVar10;
                      if (uVar8 < 0x40) {
                        pdVar9 = (double *)(lVar3 + lVar10 * 8);
                      }
                      else {
                        uVar12 = uVar8 >> 6 | 0xfc00000000000000;
                        if (0 < (long)uVar8) {
                          uVar12 = uVar8 >> 6;
                        }
                        pdVar9 = (double *)
                                 ((uVar8 + uVar12 * -0x40) * 8 + *(long *)(lVar2 + uVar12 * 8));
                      }
                      if ((3.141592653589793 < (double)ppdVar1 - *pdVar9) &&
                         (uVar15 = uVar14, uVar6 = 0, -1 < (int)(~uVar14 + local_288))) {
                        iVar11 = local_288 - uVar14;
                        do {
                          lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                        
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_node
                                            + lVar17);
                          if (0 < (int)((int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                              
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last +
                                                  lVar17) - *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                                          
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                                  lVar17)) >> 3) +
                                        (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                              
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur +
                                                  lVar17) - *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                                          
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                                  + lVar17)) >> 3) +
                                       ((((uint)((int)lVar10 -
                                                *(int *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                                
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  lVar17)) >> 3) - 1) + (uint)(lVar10 == 0)) * 0x40)
                             ) {
                            std::deque<double,_std::allocator<double>_>::pop_front
                                      ((deque<double,_std::allocator<double>_> *)local_278);
                            std::deque<double,_std::allocator<double>_>::pop_front
                                      ((deque<double,_std::allocator<double>_> *)local_280);
                            pParam = local_240;
                          }
                          iVar11 = iVar11 + -1;
                        } while (0 < iVar11);
                      }
                    }
                  }
                }
              }
            }
          }
          uVar14 = uVar6;
          local_288 = uVar15;
          __args = &local_238[0]._M_impl.super__Deque_impl_data._M_map + lVar16;
          puVar4 = *(undefined8 **)
                    ((long)&anglesvectorRPLIDAR[0].
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur + lVar17);
          if (puVar4 == (undefined8 *)
                        (*(long *)((long)&anglesvectorRPLIDAR[0].
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_finish._M_last + lVar17) + -8))
          {
            std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                      (local_278,(double *)__args);
          }
          else {
            *puVar4 = *__args;
            *(undefined8 **)
             ((long)&anglesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17) = puVar4 + 1;
          }
          pdVar9 = *(double **)
                    ((long)&distancesvectorRPLIDAR[0].
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur + lVar17);
          if (pdVar9 == (double *)
                        (*(long *)((long)&distancesvectorRPLIDAR[0].
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_finish._M_last + lVar17) + -8))
          {
            std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                      (local_280,local_138 + lVar16);
          }
          else {
            *pdVar9 = local_138[lVar16];
            *(double **)
             ((long)&distancesvectorRPLIDAR[0].super__Deque_base<double,_std::allocator<double>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur + lVar17) = pdVar9 + 1;
          }
          if (((((RPLIDAR *)pParam)->maxhist == 0) &&
              (uVar15 = uVar14 + 1, bVar5 = (int)uVar14 < (int)local_288, uVar14 = uVar15, bVar5))
             && (lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                           super__Deque_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Deque_impl_data._M_finish._M_node + lVar17
                                   ),
                0 < (int)((int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                  
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last +
                                                 lVar17) -
                                       *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                                lVar17)) >> 3) +
                          (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                  
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur +
                                                 lVar17) -
                                       *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                                + lVar17)) >> 3) +
                         ((((uint)((int)lVar10 -
                                  *(int *)((long)&anglesvectorRPLIDAR[0].
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                          lVar17)) >> 3) - 1) + (uint)(lVar10 == 0)) * 0x40))) {
            std::deque<double,_std::allocator<double>_>::pop_front
                      ((deque<double,_std::allocator<double>_> *)local_278);
            std::deque<double,_std::allocator<double>_>::pop_front
                      ((deque<double,_std::allocator<double>_> *)local_280);
          }
          if (((0 < ((RPLIDAR *)pParam)->maxhist) &&
              (lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_node + lVar17),
              ((RPLIDAR *)pParam)->maxhist <
              (int)((int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last +
                                           lVar17) -
                                 *(long *)((long)&anglesvectorRPLIDAR[0].
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                          lVar17)) >> 3) +
                    (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur +
                                           lVar17) -
                                 *(long *)((long)&anglesvectorRPLIDAR[0].
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                          + lVar17)) >> 3) +
                   ((((uint)((int)lVar10 -
                            *(int *)((long)&anglesvectorRPLIDAR[0].
                                            super__Deque_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_node + lVar17
                                    )) >> 3) - 1) + (uint)(lVar10 == 0)) * 0x40))) ||
             (lVar10 = *(long *)((long)&anglesvectorRPLIDAR[0].
                                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                        super__Deque_impl_data._M_finish._M_node + lVar17),
             0x2000 < (int)((int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last +
                                                  lVar17) -
                                         *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                    
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur +
                                                  lVar17)) >> 3) +
                            (int)((ulong)(*(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur +
                                                  lVar17) -
                                         *(long *)((long)&anglesvectorRPLIDAR[0].
                                                                                                                    
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                                  + lVar17)) >> 3) +
                           ((((uint)((int)lVar10 -
                                    *(int *)((long)&anglesvectorRPLIDAR[0].
                                                                                                        
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                            lVar17)) >> 3) - 1) + (uint)(lVar10 == 0)) * 0x40))) {
            std::deque<double,_std::allocator<double>_>::pop_front
                      ((deque<double,_std::allocator<double>_> *)local_278);
            std::deque<double,_std::allocator<double>_>::pop_front
                      ((deque<double,_std::allocator<double>_> *)local_280);
          }
          __mutex = local_248;
          lVar10 = local_250;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x20);
        local_268 = local_268 & 0xffffffff;
        if (local_26c != 0) {
          local_268 = (ulong)local_26c;
        }
        *(int *)((long)resRPLIDAR + local_250) = (int)local_268;
        pthread_mutex_unlock((pthread_mutex_t *)local_248);
      } while (*(int *)((long)bExitExpressScanRPLIDAR + lVar10) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar17 = lVar17 + 0x50;
    lVar16 = lVar16 + 0x10000;
    lVar10 = lVar10 + 4;
  } while (lVar17 != 0x500);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RPLIDARExpressScanThread(void* pParam)
{
	RPLIDAR* pRPLIDAR = (RPLIDAR*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	double distances[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	BOOL bNewScan = FALSE, bAutoNewScan = FALSE;
	int i = 0, j = 0, nb = 0, nbprev = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
	LeaveCriticalSection(&RPLIDARCS[id]);
#endif // __cplusplus

	for (;;)
	{
		//mSleep(pRPLIDAR->threadperiod);
		memset(distances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		memset(angles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
		res = GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetExpressScanDataResponseRPLIDAR(pRPLIDAR, distances, angles, &bNewScan) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RPLIDARCS[id]);
			memcpy(distancesRPLIDAR[id], distances, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			memcpy(anglesRPLIDAR[id], angles, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR*sizeof(double));
			bNewScanRPLIDAR[id] = bNewScan;

#ifdef __cplusplus
			for (i = 0; i < NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; i++)
			{
				if (pRPLIDAR->maxhist == 0)
				{
					// Try to detect the beginning of a new scan with the angle discontinuity...
					// Try to be a little bit robust w.r.t. non-decreasing outliers...
					if (((int)anglesvectorRPLIDAR[id].size() >= 5)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-5]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-4]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-3]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-2]) > M_PI)&&
						((angles[i]-anglesvectorRPLIDAR[id][(int)anglesvectorRPLIDAR[id].size()-1]) > M_PI))
						bAutoNewScan = TRUE; else bAutoNewScan = FALSE;
					if (bAutoNewScan)
					{
						// Try to automatically remove old data...
						for (j = nbprev-nb-1; j >= 0; j--)
						{
							if ((int)anglesvectorRPLIDAR[id].size() > 0)
							{
								anglesvectorRPLIDAR[id].pop_front();
								distancesvectorRPLIDAR[id].pop_front();
							}
						}
						nbprev = nb;
						nb = 0;
					}
				}

				anglesvectorRPLIDAR[id].push_back(angles[i]);
				distancesvectorRPLIDAR[id].push_back(distances[i]);

				if (pRPLIDAR->maxhist == 0)
				{
					// Try to automatically remove old data...
					nb++;
					if ((nb <= nbprev)&&((int)anglesvectorRPLIDAR[id].size() > 0))
					{
						anglesvectorRPLIDAR[id].pop_front();
						distancesvectorRPLIDAR[id].pop_front();
					}
				}
				if (((pRPLIDAR->maxhist > 0)&&((int)anglesvectorRPLIDAR[id].size() > pRPLIDAR->maxhist))||
					((int)anglesvectorRPLIDAR[id].size() > MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR))
				{
					anglesvectorRPLIDAR[id].pop_front();
					distancesvectorRPLIDAR[id].pop_front();
				}
			}
#endif // __cplusplus

			resRPLIDAR[id] = err;
			LeaveCriticalSection(&RPLIDARCS[id]);
		}
		if (bExitExpressScanRPLIDAR[id]) break;
	}

	return 0;
}